

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int ReconstructIntra16(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  uint8_t *puVar2;
  VP8Encoder *enc;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  int16_t (*paiVar10) [16];
  long lVar11;
  long lVar12;
  int16_t *piVar13;
  long lVar14;
  int16_t dc_tmp [16];
  int16_t tmp [16] [16];
  int16_t local_258 [16];
  int16_t local_238 [260];
  
  puVar2 = it->yuv_in_;
  enc = it->enc_;
  uVar1 = VP8I16ModeOffsets[mode];
  puVar3 = it->yuv_p_;
  uVar4 = *(byte *)it->mb_ >> 5 & 3;
  uVar7 = 0xfffffffffffffffe;
  piVar13 = local_238;
  do {
    (*VP8FTransform2)(puVar2 + VP8Scan[uVar7 + 2],puVar3 + (ulong)VP8Scan[uVar7 + 2] + (ulong)uVar1,
                      piVar13);
    uVar7 = uVar7 + 2;
    piVar13 = piVar13 + 0x20;
  } while (uVar7 < 0xe);
  (*VP8FTransformWHT)(local_238,local_258);
  iVar5 = (*VP8EncQuantizeBlockWHT)(local_258,rd->y_dc_levels,&enc->dqm_[uVar4].y2_);
  uVar6 = iVar5 << 0x18;
  if (it->do_trellis_ == 0) {
    paiVar10 = rd->y_ac_levels;
    uVar7 = 0xfffffffffffffffe;
    piVar13 = local_238;
    do {
      piVar13[0x10] = 0;
      *piVar13 = 0;
      iVar5 = (*VP8EncQuantize2Blocks)(piVar13,*paiVar10,&enc->dqm_[uVar4].y1_);
      uVar7 = uVar7 + 2;
      uVar6 = uVar6 | iVar5 << ((byte)uVar7 & 0x1f);
      piVar13 = piVar13 + 0x20;
      paiVar10 = paiVar10 + 2;
    } while (uVar7 < 0xe);
  }
  else {
    VP8IteratorNzToBytes(it);
    lVar14 = 0;
    lVar12 = 0;
    do {
      lVar11 = (long)(int)lVar12;
      lVar8 = 0;
      piVar9 = it->top_nz_;
      lVar12 = lVar11;
      do {
        iVar5 = TrellisQuantizeBlock
                          (enc,(int16_t *)((long)local_238 + lVar8 + lVar11 * 0x20),
                           (int16_t *)((long)rd->y_ac_levels[lVar11] + lVar8),
                           it->left_nz_[lVar14] + *piVar9,0,&enc->dqm_[uVar4].y1_,
                           enc->dqm_[uVar4].lambda_trellis_i16_);
        it->left_nz_[lVar14] = iVar5;
        *piVar9 = iVar5;
        *(undefined2 *)((long)rd->y_ac_levels[lVar11] + lVar8) = 0;
        uVar6 = uVar6 | iVar5 << ((byte)lVar12 & 0x1f);
        lVar12 = lVar12 + 1;
        piVar9 = piVar9 + 1;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x80);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  piVar13 = local_238;
  (*VP8TransformWHT)(local_258,piVar13);
  uVar7 = 0xfffffffffffffffe;
  do {
    (*VP8ITransform)(puVar3 + (ulong)VP8Scan[uVar7 + 2] + (ulong)uVar1,piVar13,
                     yuv_out + VP8Scan[uVar7 + 2],1);
    uVar7 = uVar7 + 2;
    piVar13 = piVar13 + 0x20;
  } while (uVar7 < 0xe);
  return uVar6;
}

Assistant:

static int ReconstructIntra16(VP8EncIterator* const it,
                              VP8ModeScore* const rd,
                              uint8_t* const yuv_out,
                              int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I16ModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + Y_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[16][16], dc_tmp[16];

  for (n = 0; n < 16; n += 2) {
    VP8FTransform2(src + VP8Scan[n], ref + VP8Scan[n], tmp[n]);
  }
  VP8FTransformWHT(tmp[0], dc_tmp);
  nz |= VP8EncQuantizeBlockWHT(dc_tmp, rd->y_dc_levels, &dqm->y2_) << 24;

  if (DO_TRELLIS_I16 && it->do_trellis_) {
    int x, y;
    VP8IteratorNzToBytes(it);
    for (y = 0, n = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x, ++n) {
        const int ctx = it->top_nz_[x] + it->left_nz_[y];
        const int non_zero = TrellisQuantizeBlock(
            enc, tmp[n], rd->y_ac_levels[n], ctx, TYPE_I16_AC, &dqm->y1_,
            dqm->lambda_trellis_i16_);
        it->top_nz_[x] = it->left_nz_[y] = non_zero;
        rd->y_ac_levels[n][0] = 0;
        nz |= non_zero << n;
      }
    }
  } else {
    for (n = 0; n < 16; n += 2) {
      // Zero-out the first coeff, so that: a) nz is correct below, and
      // b) finding 'last' non-zero coeffs in SetResidualCoeffs() is simplified.
      tmp[n][0] = tmp[n + 1][0] = 0;
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->y_ac_levels[n], &dqm->y1_) << n;
      assert(rd->y_ac_levels[n + 0][0] == 0);
      assert(rd->y_ac_levels[n + 1][0] == 0);
    }
  }

  // Transform back
  VP8TransformWHT(dc_tmp, tmp[0]);
  for (n = 0; n < 16; n += 2) {
    VP8ITransform(ref + VP8Scan[n], tmp[n], yuv_out + VP8Scan[n], 1);
  }

  return nz;
}